

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
          (SACSubcaseBase *this,GLuint buffer,GLintptr offset,GLuint expected_value)

{
  CallLogWrapper *this_00;
  GLuint value;
  uint local_2c;
  
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,buffer);
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x92c0,offset,4,&local_2c);
  if (local_2c != expected_value) {
    anon_unknown_0::Output
              ("Counter value is %u should be %u.\n",(ulong)local_2c,(ulong)expected_value);
  }
  return local_2c == expected_value;
}

Assistant:

bool CheckFinalCounterValue(GLuint buffer, GLintptr offset, GLuint expected_value)
	{
		GLuint value;
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer);
		glGetBufferSubData(GL_ATOMIC_COUNTER_BUFFER, offset, 4, &value);
		if (value != expected_value)
		{
			Output("Counter value is %u should be %u.\n", value, expected_value);
			return false;
		}
		return true;
	}